

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

tuple<graph,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
* read_model<std::ifstream>
            (tuple<graph,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
             *__return_storage_ptr__,basic_ifstream<char,_std::char_traits<char>_> *stream)

{
  undefined1 local_c0 [8];
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  volt;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  res;
  int local_88;
  int iStack_84;
  bool value;
  int j;
  int i;
  graph g;
  int r;
  string local_38 [8];
  string dummy;
  basic_ifstream<char,_std::char_traits<char>_> *stream_local;
  
  dummy.field_2._8_8_ = stream;
  std::__cxx11::string::string(local_38);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)dummy.field_2._8_8_,local_38);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)dummy.field_2._8_8_,local_38);
  std::istream::operator>>
            ((istream *)dummy.field_2._8_8_,
             (int *)&g.treeAdjMat.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)dummy.field_2._8_8_,local_38);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)dummy.field_2._8_8_,local_38);
  graph::graph((graph *)&j,
               (int)g.treeAdjMat.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  for (iStack_84 = 0;
      iStack_84 !=
      (int)g.treeAdjMat.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage; iStack_84 = iStack_84 + 1) {
    for (local_88 = 0;
        local_88 !=
        (int)g.treeAdjMat.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage; local_88 = local_88 + 1) {
      std::istream::operator>>
                ((istream *)dummy.field_2._8_8_,
                 (bool *)((long)&res.
                                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      if ((iStack_84 <= local_88) &&
         ((res.
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0)) {
        graph::addEdge((graph *)&j,iStack_84,local_88);
      }
    }
  }
  readMatrix<std::ifstream>
            ((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)&volt.
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (basic_ifstream<char,_std::char_traits<char>_> *)dummy.field_2._8_8_,
             (int)g.treeAdjMat.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  readMatrix<std::ifstream>
            ((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)local_c0,(basic_ifstream<char,_std::char_traits<char>_> *)dummy.field_2._8_8_,
             (int)g.treeAdjMat.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  make_tuple<graph&,std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>&,std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>&>
            (__return_storage_ptr__,(graph *)&j,
             (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)&volt.
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)local_c0);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)local_c0);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)&volt.
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  graph::~graph((graph *)&j);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

inline auto read_model(auto &stream){
    std::string dummy;
    std::getline(stream, dummy);
    std::getline(stream, dummy);
    int r;
    stream >> r;
    std::getline(stream, dummy);
    std::getline(stream, dummy);
    graph g(r);
    for (int i = 0;i != r;++i)
        for (int j = 0;j != r;++j){
            bool value;
            stream >> value;
            if(i <= j && value)
                g.addEdge(i,j);
        }
    auto res = readMatrix(stream, r);
    auto volt = readMatrix(stream, r);
    return std::make_tuple(g, res, volt);
}